

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidLayerNormalizationNoGammaOrBeta(void)

{
  ulong uVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  NeuralNetwork *pNVar7;
  NeuralNetworkLayer *this;
  LayerNormalizationLayerParams *this_00;
  ostream *poVar8;
  string *psVar9;
  long lVar10;
  WeightParams *this_01;
  undefined8 *puVar11;
  int iVar12;
  char *pcVar13;
  Model m;
  Result res2;
  Result res1;
  
  CoreML::Specification::Model::Model(&m);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->input_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar11 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar11 = (undefined8 *)*puVar11;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"input",puVar11);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,2);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->output_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar11 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar11 = (undefined8 *)*puVar11;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"output",puVar11);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,2);
  pNVar7 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m);
  pNVar7->arrayinputshapemapping_ = 1;
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar7->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"output");
  this_00 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_layernormalization(this);
  CoreML::Specification::LayerNormalizationLayerParams::_internal_add_normalizedshape(this_00,1);
  CoreML::validate<(MLModelType)500>(&res1,&m);
  bVar2 = CoreML::Result::good(&res1);
  if (bVar2) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x16e1);
    poVar8 = std::operator<<(poVar8,": error: ");
    pcVar13 = "!((res1).good())";
  }
  else {
    psVar9 = CoreML::Result::message_abi_cxx11_(&res1);
    lVar10 = std::__cxx11::string::find((char *)psVar9,0x2e3215);
    if (lVar10 != -1) {
      this_01 = CoreML::Specification::LayerNormalizationLayerParams::_internal_mutable_gamma
                          (this_00);
      CoreML::Specification::WeightParams::_internal_add_floatvalue(this_01,1.0);
      CoreML::validate<(MLModelType)500>(&res2,&m);
      bVar2 = CoreML::Result::good(&res2);
      if (bVar2) {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar8 = std::operator<<(poVar8,":");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x16e8);
        poVar8 = std::operator<<(poVar8,": error: ");
        pcVar13 = "!((res2).good())";
LAB_0015c73b:
        poVar8 = std::operator<<(poVar8,pcVar13);
        poVar8 = std::operator<<(poVar8," was false, expected true.");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar12 = 1;
      }
      else {
        psVar9 = CoreML::Result::message_abi_cxx11_(&res2);
        iVar12 = 0;
        lVar10 = std::__cxx11::string::find((char *)psVar9,0x2e324d);
        if (lVar10 == -1) {
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar8 = std::operator<<(poVar8,":");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x16e9);
          poVar8 = std::operator<<(poVar8,": error: ");
          pcVar13 = "res2.message().find(\"Beta\") != std::string::npos";
          goto LAB_0015c73b;
        }
      }
      std::__cxx11::string::~string((string *)&res2.m_message);
      goto LAB_0015c767;
    }
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x16e2);
    poVar8 = std::operator<<(poVar8,": error: ");
    pcVar13 = "res1.message().find(\"Gamma\") != std::string::npos";
  }
  poVar8 = std::operator<<(poVar8,pcVar13);
  poVar8 = std::operator<<(poVar8," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar8);
  iVar12 = 1;
LAB_0015c767:
  std::__cxx11::string::~string((string *)&res1.m_message);
  CoreML::Specification::Model::~Model(&m);
  return iVar12;
}

Assistant:

int testInvalidLayerNormalizationNoGammaOrBeta() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    auto* params = layers->mutable_layernormalization();
    params->add_normalizedshape(1);

    // not specifying the gamma parameter
    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("Gamma") != std::string::npos);

    // not specifying the beta parameter
    params->mutable_gamma()->add_floatvalue(1.0);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("Beta") != std::string::npos);

    return 0;

}